

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void * ggml_malloc(size_t size)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  
  if (size == 0) {
    pvVar1 = (void *)0x0;
    ggml_log_internal(GGML_LOG_LEVEL_WARN,
                      "Behavior may be unexpected when allocating 0 bytes for ggml_malloc!\n");
  }
  else {
    pvVar1 = malloc(size);
    if (pvVar1 == (void *)0x0) {
      auVar2._8_4_ = (int)(size >> 0x20);
      auVar2._0_8_ = size;
      auVar2._12_4_ = 0x45300000;
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %6.2f MB\n",
                        ((auVar2._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) *
                        9.5367431640625e-07,"ggml_malloc");
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
                 ,0x144,"fatal error");
    }
  }
  return pvVar1;
}

Assistant:

inline static void * ggml_malloc(size_t size) {
    if (size == 0) {
        GGML_LOG_WARN("Behavior may be unexpected when allocating 0 bytes for ggml_malloc!\n");
        return NULL;
    }
    void * result = malloc(size);
    if (result == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate %6.2f MB\n", __func__, size/(1024.0*1024.0));
        GGML_ABORT("fatal error");
    }
    return result;
}